

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O2

spv_result_t
spvtools::val::anon_unknown_2::ValidateTensorDim(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  uint id;
  uint32_t uVar2;
  Instruction *pIVar3;
  char *pcVar4;
  uint64_t dim_value;
  string local_220;
  DiagnosticStream local_200;
  
  id = Instruction::GetOperandAs<unsigned_int>(inst,1);
  pIVar3 = ValidationState_t::FindDef(_,id);
  if (((pIVar3 == (Instruction *)0x0) ||
      (bVar1 = ValidationState_t::IsIntScalarType(_,(pIVar3->inst_).type_id), !bVar1)) ||
     (uVar2 = ValidationState_t::GetBitWidth(_,(pIVar3->inst_).type_id), uVar2 != 0x20)) {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    pcVar4 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator<<((ostream *)&local_200,pcVar4);
    std::operator<<((ostream *)&local_200," Dim <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_220,_,id);
    std::operator<<((ostream *)&local_200,(string *)&local_220);
    pcVar4 = " is not a 32-bit integer.";
  }
  else {
    bVar1 = ValidationState_t::EvalConstantValUint64(_,id,&dim_value);
    if (!bVar1) {
      return SPV_SUCCESS;
    }
    if (0xfffffffffffffffa < dim_value - 6) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_ID,inst);
    pcVar4 = spvOpcodeString((uint)(inst->inst_).opcode);
    std::operator<<((ostream *)&local_200,pcVar4);
    std::operator<<((ostream *)&local_200," Dim <id> ");
    ValidationState_t::getIdName_abi_cxx11_(&local_220,_,id);
    std::operator<<((ostream *)&local_200,(string *)&local_220);
    std::operator<<((ostream *)&local_200," must be between 1 and ");
    std::ostream::_M_insert<unsigned_long>((ulong)&local_200);
    pcVar4 = ".";
  }
  std::operator<<((ostream *)&local_200,pcVar4);
  std::__cxx11::string::_M_dispose();
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateTensorDim(ValidationState_t& _, const Instruction* inst) {
  const auto dim_index = 1;
  const auto dim_id = inst->GetOperandAs<uint32_t>(dim_index);
  const auto dim = _.FindDef(dim_id);
  if (!dim || !_.IsIntScalarType(dim->type_id()) ||
      _.GetBitWidth(dim->type_id()) != 32) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << spvOpcodeString(inst->opcode()) << " Dim <id> "
           << _.getIdName(dim_id) << " is not a 32-bit integer.";
  }

  constexpr uint32_t max_tensor_dim = 5;

  uint64_t dim_value;
  if (_.EvalConstantValUint64(dim_id, &dim_value)) {
    if (dim_value == 0 || dim_value > max_tensor_dim) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << spvOpcodeString(inst->opcode()) << " Dim <id> "
             << _.getIdName(dim_id) << " must be between 1 and "
             << max_tensor_dim << ".";
    }
  }

  return SPV_SUCCESS;
}